

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileTargetGenerator.cxx
# Opt level: O0

void __thiscall
cmMakefileTargetGenerator::CreateLinkScript
          (cmMakefileTargetGenerator *this,char *name,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *link_commands,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *makefile_commands,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *makefile_depends)

{
  cmLocalUnixMakefileGenerator3 *this_00;
  bool bVar1;
  char *pcVar2;
  ulong uVar3;
  reference pbVar4;
  ostream *poVar5;
  allocator local_341;
  string local_340;
  string local_320;
  string local_300;
  allocator local_2d9;
  undefined1 local_2d8 [8];
  string link_command;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_2b0;
  const_iterator cmd;
  cmGeneratedFileStream linkScriptStream;
  undefined1 local_50 [8];
  string linkScriptName;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *makefile_depends_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *makefile_commands_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *link_commands_local;
  char *name_local;
  cmMakefileTargetGenerator *this_local;
  
  linkScriptName.field_2._8_8_ = makefile_depends;
  std::__cxx11::string::string((string *)local_50,(string *)&this->TargetBuildDirectoryFull);
  std::__cxx11::string::operator+=((string *)local_50,"/");
  std::__cxx11::string::operator+=((string *)local_50,name);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  cmGeneratedFileStream::cmGeneratedFileStream((cmGeneratedFileStream *)&cmd,pcVar2,false,None);
  cmGeneratedFileStream::SetCopyIfDifferent((cmGeneratedFileStream *)&cmd,true);
  local_2b0._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin(link_commands);
  while( true ) {
    link_command.field_2._8_8_ =
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end(link_commands);
    bVar1 = __gnu_cxx::operator!=
                      (&local_2b0,
                       (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)((long)&link_command.field_2 + 8));
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator->(&local_2b0);
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) == 0) {
      pbVar4 = __gnu_cxx::
               __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&local_2b0);
      pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)pbVar4);
      if (*pcVar2 != ':') {
        pbVar4 = __gnu_cxx::
                 __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*(&local_2b0);
        poVar5 = std::operator<<((ostream *)&cmd,(string *)pbVar4);
        std::operator<<(poVar5,"\n");
      }
    }
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&local_2b0);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)local_2d8,"$(CMAKE_COMMAND) -E cmake_link_script ",&local_2d9);
  std::allocator<char>::~allocator((allocator<char> *)&local_2d9);
  this_00 = this->LocalGenerator;
  pcVar2 = cmLocalGenerator::GetCurrentBinaryDirectory((cmLocalGenerator *)this_00);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_340,pcVar2,&local_341);
  cmLocalUnixMakefileGenerator3::MaybeConvertToRelativePath
            (&local_320,this_00,&local_340,(string *)local_50);
  cmOutputConverter::ConvertToOutputFormat
            (&local_300,
             &(this_00->super_cmLocalCommonGenerator).super_cmLocalGenerator.super_cmOutputConverter
             ,&local_320,SHELL);
  std::__cxx11::string::operator+=((string *)local_2d8,(string *)&local_300);
  std::__cxx11::string::~string((string *)&local_300);
  std::__cxx11::string::~string((string *)&local_320);
  std::__cxx11::string::~string((string *)&local_340);
  std::allocator<char>::~allocator((allocator<char> *)&local_341);
  std::__cxx11::string::operator+=((string *)local_2d8," --verbose=$(VERBOSE)");
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(makefile_commands,(value_type *)local_2d8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)linkScriptName.field_2._8_8_,(value_type *)local_50);
  std::__cxx11::string::~string((string *)local_2d8);
  cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)&cmd);
  std::__cxx11::string::~string((string *)local_50);
  return;
}

Assistant:

void cmMakefileTargetGenerator::CreateLinkScript(
  const char* name, std::vector<std::string> const& link_commands,
  std::vector<std::string>& makefile_commands,
  std::vector<std::string>& makefile_depends)
{
  // Create the link script file.
  std::string linkScriptName = this->TargetBuildDirectoryFull;
  linkScriptName += "/";
  linkScriptName += name;
  cmGeneratedFileStream linkScriptStream(linkScriptName.c_str());
  linkScriptStream.SetCopyIfDifferent(true);
  for (std::vector<std::string>::const_iterator cmd = link_commands.begin();
       cmd != link_commands.end(); ++cmd) {
    // Do not write out empty commands or commands beginning in the
    // shell no-op ":".
    if (!cmd->empty() && (*cmd)[0] != ':') {
      linkScriptStream << *cmd << "\n";
    }
  }

  // Create the makefile command to invoke the link script.
  std::string link_command = "$(CMAKE_COMMAND) -E cmake_link_script ";
  link_command += this->LocalGenerator->ConvertToOutputFormat(
    this->LocalGenerator->MaybeConvertToRelativePath(
      this->LocalGenerator->GetCurrentBinaryDirectory(), linkScriptName),
    cmOutputConverter::SHELL);
  link_command += " --verbose=$(VERBOSE)";
  makefile_commands.push_back(link_command);
  makefile_depends.push_back(linkScriptName);
}